

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BehaviourTree.h
# Opt level: O0

Status __thiscall BehaviourTree::Invert::run(Invert *this)

{
  bool bVar1;
  Node *this_00;
  Status local_28;
  Status s_1;
  Status s;
  Node *child;
  Invert *this_local;
  
  this_00 = DecoratorNode::getChild(&this->super_DecoratorNode);
  bVar1 = Node::dontSkip(this_00);
  if (bVar1) {
    this_local._4_4_ = (*this_00->_vptr_Node[2])();
    (this->super_DecoratorNode).super_Node._lastStatus = this_local._4_4_;
    if (this_local._4_4_ == FAILURE) {
      this_local._4_4_ = SUCCESS;
    }
    else if (this_local._4_4_ == SUCCESS) {
      this_local._4_4_ = FAILURE;
    }
  }
  else {
    bVar1 = Node::isCompleted(this_00);
    if (bVar1) {
      local_28 = Node::getLastStatus(this_00);
    }
    else {
      local_28 = (*this_00->_vptr_Node[2])();
      (this->super_DecoratorNode).super_Node._lastStatus = local_28;
      if (local_28 != RUNNING) {
        (this->super_DecoratorNode).super_Node._completed = true;
      }
    }
    if (local_28 == FAILURE) {
      this_local._4_4_ = SUCCESS;
    }
    else if (local_28 == SUCCESS) {
      this_local._4_4_ = FAILURE;
    }
    else {
      this_local._4_4_ = local_28;
    }
  }
  return this_local._4_4_;
}

Assistant:

virtual Status run() override {
			Node* child = getChild();
			if (child->dontSkip()) {
				// run at each and every iteration
				const Status s = child->run();
				_lastStatus = s;
				switch (s)
				{
				case Status::SUCCESS: return Status::FAILURE;
				case Status::FAILURE: return Status::SUCCESS;
				default: return s;
				}
			}
			else {
				// if the job has already been done, return the status
				// else execute it
				Status s;
				if (child->isCompleted()) {
					s = child->getLastStatus();
				}
				else {
					s = child->run();
					_lastStatus = s;
					if (s != Status::RUNNING)
						_completed = true;
				}
				switch (s)
				{
				case Status::SUCCESS: return Status::FAILURE;
				case Status::FAILURE: return Status::SUCCESS;
				default: return s;
				}
			}
		}